

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

bool __thiscall
estl::
sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
::key_is_last_element
          (sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  size_type sVar1;
  __type _Var2;
  
  sVar1 = (this->data_vec_).size_;
  if (sVar1 != 0) {
    _Var2 = std::operator==(&(this->data_vec_).data_ptr_[sVar1 - 1].first,key);
    return _Var2;
  }
  return false;
}

Assistant:

size_type     size        () const noexcept {   return size_;         }